

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O3

void __thiscall QBitArray::QBitArray(QBitArray *this,qsizetype size,bool value)

{
  byte *pbVar1;
  Data *pDVar2;
  char *pcVar3;
  quint8 *c;
  qsizetype size_00;
  
  size_00 = 0;
  if (0 < size) {
    size_00 = (size + 7U >> 3) + 1;
  }
  QByteArray::QByteArray(&this->d,size_00,-value);
  if (0 < size) {
    pDVar2 = (this->d).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData(&this->d,(this->d).d.size,KeepSize);
    }
    pcVar3 = (this->d).d.ptr;
    *pcVar3 = (char)((int)(this->d).d.size << 3) - (char)size;
    if ((size & 7U) != 0) {
      pbVar1 = (byte *)(pcVar3 + ((ulong)size >> 3) + 1);
      *pbVar1 = *pbVar1 & ~(-1 << (sbyte)(size & 7U));
    }
  }
  return;
}

Assistant:

QBitArray::QBitArray(qsizetype size, bool value)
    : d(allocation_size(size), value ? 0xFF : 0x00)
{
    Q_ASSERT_X(size >= 0, "QBitArray::QBitArray", "Size must be greater than or equal to 0.");
    if (size <= 0)
        return;

    adjust_head_and_tail(d.data(), d.size(), size);
}